

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LinearList.cpp
# Opt level: O3

void printout(LinearList *L)

{
  char *pcVar1;
  long lVar2;
  
  if (0 < L->Last) {
    lVar2 = 0;
    do {
      pcVar1 = "";
      if (lVar2 != 0) {
        pcVar1 = " ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cout,pcVar1,(ulong)(lVar2 != 0));
      std::ostream::operator<<((ostream *)&std::cout,L->data[lVar2]);
      lVar2 = lVar2 + 1;
    } while (lVar2 < L->Last);
  }
  std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x70);
  std::ostream::put(-0x70);
  std::ostream::flush();
  return;
}

Assistant:

void printout(LinearList *L)  //打印线性表的表目
{
    int i;
    for(i = 0; i < L->Last; i++)
        cout << (i==0?"":" ") << L->data[i];
    cout << endl;
}